

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O3

void __thiscall V2Reverb::reset(V2Reverb *this)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = 0;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    lVar4 = 0;
    do {
      memset(*(void **)(this->gaina + lVar3 * 0x10 + lVar4 + 8),0,
             (ulong)(uint)this->gaina[lVar3 * 0x10 + lVar4 + 7] << 2);
      this->gaina[lVar3 * 0x10 + lVar4 + 6] = 0.0;
      *(undefined4 *)((long)this->combl[lVar3] + lVar4) = 0;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x10);
    memset(*(void **)(this->combl[lVar3 * 2 + 2] + 2),0,
           (ulong)(uint)this->combl[lVar3 * 2 + 2][1] << 2);
    this->combl[lVar3 * 2 + 2][0] = 0.0;
    memset(*(void **)(this->hpf + lVar3 * 8 + -10),0,(ulong)(uint)this->hpf[lVar3 * 8 + -0xb] << 2);
    this->combl[lVar3 * 2 + 3][0] = 0.0;
    this->hpf[lVar3] = 0.0;
    lVar3 = 1;
    bVar2 = false;
  } while (bVar1);
  return;
}

Assistant:

void reset()
    {
        for (int ch=0; ch < 2; ch++)
        {
            // comb
            for (int i=0; i < 4; i++)
            {
                combd[ch][i].reset();
                combl[ch][i] = 0.0f;
            }

            // allpass
            for (int i=0; i < 2; i++)
                alld[ch][i].reset();

            // low cut
            hpf[ch] = 0.0f;
        }
    }